

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix.c
# Opt level: O0

int main(int argc,char **argv)

{
  parasail_matrix_t *ppVar1;
  parasail_matrix_t *ppVar2;
  long lVar3;
  parasail_matrix_t *matrix_00;
  undefined1 local_a8 [4];
  int pssm_length;
  int pssm_values [24];
  char *pssm_alphabet;
  parasail_matrix_t *user_matrix_copy;
  parasail_matrix_t *user_matrix;
  parasail_matrix_t *internal_matrix;
  parasail_matrix_t *matrix;
  char **argv_local;
  int argc_local;
  
  memcpy(local_a8,&DAT_00102120,0x60);
  if (argc == 2) {
    ppVar1 = (parasail_matrix_t *)parasail_matrix_from_file(argv[1]);
    print_matrix(ppVar1);
    print_mapper(ppVar1);
    parasail_matrix_free(ppVar1);
  }
  else {
    printf("missing matrix file argument, skipping that part of the test\n");
  }
  print_matrix(&parasail_blosum62);
  print_mapper(&parasail_blosum62);
  ppVar1 = (parasail_matrix_t *)parasail_matrix_lookup("blosum62");
  if (ppVar1 == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"matrix lookup failed");
    exit(1);
  }
  ppVar2 = (parasail_matrix_t *)parasail_matrix_create("ACGT",2,0xffffffff);
  if (ppVar2 == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"matrix create failed");
    exit(1);
  }
  print_matrix(ppVar2);
  print_mapper(ppVar2);
  parasail_matrix_free(ppVar2);
  ppVar2 = (parasail_matrix_t *)parasail_matrix_create_case_sensitive("AcgT",2,0xffffffff);
  if (ppVar2 == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"matrix create failed");
    exit(1);
  }
  print_matrix(ppVar2);
  print_mapper(ppVar2);
  parasail_matrix_free(ppVar2);
  ppVar2 = (parasail_matrix_t *)parasail_matrix_create_case_sensitive("ACGTacgt",2,0xffffffff);
  if (ppVar2 == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"matrix create failed");
    exit(1);
  }
  print_matrix(ppVar2);
  print_mapper(ppVar2);
  parasail_matrix_free(ppVar2);
  lVar3 = parasail_matrix_copy(ppVar1);
  if (lVar3 == 0) {
    fprintf(_stderr,"matrix copy failed");
    exit(1);
  }
  parasail_matrix_set_value(lVar3,10,10,100);
  if (*(int *)(lVar3 + 0x1c) != 100) {
    fprintf(_stderr,"matrix set value failed");
    exit(1);
  }
  parasail_matrix_free(lVar3);
  ppVar2 = (parasail_matrix_t *)parasail_matrix_pssm_create("abcdef",local_a8,4);
  if (ppVar2 == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"pssm matrix create failed");
    exit(1);
  }
  print_matrix(ppVar2);
  print_mapper(ppVar2);
  matrix_00 = (parasail_matrix_t *)parasail_matrix_copy(ppVar2);
  if (matrix_00 == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"pssm matrix copy failed");
    exit(1);
  }
  parasail_matrix_free(ppVar2);
  print_matrix(matrix_00);
  print_mapper(matrix_00);
  parasail_matrix_free(matrix_00);
  ppVar2 = (parasail_matrix_t *)parasail_matrix_convert_square_to_pssm(ppVar1,"asdf",4);
  print_matrix(ppVar2);
  print_mapper(ppVar2);
  parasail_matrix_free(ppVar2);
  print_matrix(ppVar1);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    parasail_matrix_t *matrix = NULL;
    const parasail_matrix_t *internal_matrix = NULL;
    parasail_matrix_t *user_matrix = NULL;
    parasail_matrix_t *user_matrix_copy = NULL;
    const char *pssm_alphabet = "abcdef";
    const int pssm_values[] = {
        0,  1,  2,  3,   4,  5,
        6,  7,  8,  9,  10, 11,
        12, 13, 14, 15, 16, 17,
        18, 19, 20, 21, 22, 23
    };
    const int pssm_length = 4;

    if (argc == 2) {
        matrix = parasail_matrix_from_file(argv[1]);
        print_matrix(matrix);
        print_mapper(matrix);
        parasail_matrix_free(matrix);
    }
    else {
        printf("missing matrix file argument, skipping that part of the test\n");
    }

    print_matrix(&parasail_blosum62);
    print_mapper(&parasail_blosum62);

    internal_matrix = parasail_matrix_lookup("blosum62");
    if (NULL == internal_matrix) {
        fprintf(stderr, "matrix lookup failed");
        exit(EXIT_FAILURE);
    }

    user_matrix = parasail_matrix_create("ACGT", 2, -1);
    if (NULL == user_matrix) {
        fprintf(stderr, "matrix create failed");
        exit(EXIT_FAILURE);
    }
    print_matrix(user_matrix);
    print_mapper(user_matrix);
    parasail_matrix_free(user_matrix);

    user_matrix = parasail_matrix_create_case_sensitive("AcgT", 2, -1);
    if (NULL == user_matrix) {
        fprintf(stderr, "matrix create failed");
        exit(EXIT_FAILURE);
    }
    print_matrix(user_matrix);
    print_mapper(user_matrix);
    parasail_matrix_free(user_matrix);

    user_matrix = parasail_matrix_create_case_sensitive("ACGTacgt", 2, -1);
    if (NULL == user_matrix) {
        fprintf(stderr, "matrix create failed");
        exit(EXIT_FAILURE);
    }
    print_matrix(user_matrix);
    print_mapper(user_matrix);
    parasail_matrix_free(user_matrix);

    user_matrix = parasail_matrix_copy(internal_matrix);
    if (NULL == user_matrix) {
        fprintf(stderr, "matrix copy failed");
        exit(EXIT_FAILURE);
    }

    parasail_matrix_set_value(user_matrix, 10, 10, 100);
    if (100 != user_matrix->max) {
        fprintf(stderr, "matrix set value failed");
        exit(EXIT_FAILURE);
    }

    parasail_matrix_free(user_matrix);

    user_matrix = parasail_matrix_pssm_create(
            pssm_alphabet,
            pssm_values,
            pssm_length);
    if (NULL == user_matrix) {
        fprintf(stderr, "pssm matrix create failed");
        exit(EXIT_FAILURE);
    }
    print_matrix(user_matrix);
    print_mapper(user_matrix);

    user_matrix_copy = parasail_matrix_copy(user_matrix);
    if (NULL == user_matrix_copy) {
        fprintf(stderr, "pssm matrix copy failed");
        exit(EXIT_FAILURE);
    }
    parasail_matrix_free(user_matrix);

    print_matrix(user_matrix_copy);
    print_mapper(user_matrix_copy);
    parasail_matrix_free(user_matrix_copy);

    user_matrix = parasail_matrix_convert_square_to_pssm(internal_matrix, "asdf", 4);
    print_matrix(user_matrix);
    print_mapper(user_matrix);
    parasail_matrix_free(user_matrix);

    print_matrix(internal_matrix);

    return 0;
}